

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void testutil_random_fe_magnitude(secp256k1_fe *fe,int m)

{
  uint32_t uVar1;
  secp256k1_fe zero;
  
  uVar1 = testrand_int(m + 1);
  secp256k1_fe_normalize(fe);
  if (uVar1 != 0) {
    secp256k1_fe_set_int(&zero,0);
    secp256k1_fe_negate_unchecked(&zero,&zero,0);
    secp256k1_fe_mul_int_unchecked(&zero,uVar1 - 1);
    secp256k1_fe_add(fe,&zero);
    if (fe->magnitude != uVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/testutil.h"
              ,0x2a,"test condition failed: fe->magnitude == n");
      abort();
    }
  }
  return;
}

Assistant:

static void testutil_random_fe_magnitude(secp256k1_fe *fe, int m) {
    secp256k1_fe zero;
    int n = testrand_int(m + 1);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_set_int(&zero, 0);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}